

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

bool __thiscall
QSocks5SocketEngine::setOption(QSocks5SocketEngine *this,SocketOption option,int value)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long **)(*(long *)(this + 8) + 0xf8) == (long *)0x0) ||
     (plVar1 = (long *)**(long **)(*(long *)(this + 8) + 0xf8), plVar1 == (long *)0x0)) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    if (option == KeepAliveOption) {
      QVariant::QVariant(&local_40,value);
      lVar2 = *plVar1;
      uVar4 = 1;
    }
    else {
      if (option != LowDelayOption) goto LAB_0023fcf5;
      QVariant::QVariant(&local_40,value);
      lVar2 = *plVar1;
      uVar4 = 0;
    }
    (**(code **)(lVar2 + 0x120))(plVar1,uVar4,&local_40);
    QVariant::~QVariant(&local_40);
  }
LAB_0023fcf5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::setOption(SocketOption option, int value)
{
    Q_D(QSocks5SocketEngine);
    if (d->data && d->data->controlSocket) {
        // convert the enum and call the real socket
        if (option == QAbstractSocketEngine::LowDelayOption)
            d->data->controlSocket->setSocketOption(QAbstractSocket::LowDelayOption, value);
        if (option == QAbstractSocketEngine::KeepAliveOption)
            d->data->controlSocket->setSocketOption(QAbstractSocket::KeepAliveOption, value);
        return true;
    }
    return false;
}